

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

void secp256k1_effective_nonce(secp256k1_gej *out_nonce,secp256k1_ge *nonce_pts,secp256k1_scalar *b)

{
  secp256k1_gej tmp;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_8c0;
  secp256k1_gej local_8a8;
  secp256k1_fe local_828 [8];
  secp256k1_ge local_6e8 [8];
  secp256k1_strauss_point_state local_428;
  
  local_8a8.infinity = nonce_pts[1].infinity;
  local_8a8.x.n[0] = nonce_pts[1].x.n[0];
  local_8a8.x.n[1] = nonce_pts[1].x.n[1];
  local_8a8.x.n[2] = nonce_pts[1].x.n[2];
  local_8a8.x.n[3] = nonce_pts[1].x.n[3];
  local_8a8.x.n[4] = nonce_pts[1].x.n[4];
  local_8a8.y.n[0] = nonce_pts[1].y.n[0];
  local_8a8.y.n[1] = nonce_pts[1].y.n[1];
  local_8a8.y.n[2] = nonce_pts[1].y.n[2];
  local_8a8.y.n[3] = nonce_pts[1].y.n[3];
  local_8a8.y.n[4] = nonce_pts[1].y.n[4];
  local_8a8.z.n[0] = 1;
  local_8a8.z.n[1] = 0;
  local_8a8.z.n[2] = 0;
  local_8a8.z.n[3] = 0;
  local_8a8.z.n[4] = 0;
  local_8c0.aux = local_828;
  local_8c0.pre_a = local_6e8;
  local_8c0.ps = &local_428;
  secp256k1_ecmult_strauss_wnaf(&local_8c0,out_nonce,1,&local_8a8,b,(secp256k1_scalar *)0x0);
  secp256k1_gej_add_ge_var(out_nonce,out_nonce,nonce_pts,(secp256k1_fe *)0x0);
  return;
}

Assistant:

static void secp256k1_effective_nonce(secp256k1_gej *out_nonce, const secp256k1_ge *nonce_pts, const secp256k1_scalar *b) {
    secp256k1_gej tmp;

    secp256k1_gej_set_ge(&tmp, &nonce_pts[1]);
    secp256k1_ecmult(out_nonce, &tmp, b, NULL);
    secp256k1_gej_add_ge_var(out_nonce, out_nonce, &nonce_pts[0], NULL);
}